

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_log__do_push_element_hexdump(char *prefix,size_t prefix_len,void *s,size_t l)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_FS_OFFSET;
  size_t l_local;
  void *s_local;
  size_t prefix_len_local;
  char *prefix_local;
  
  iVar3 = expand_logbuf_or_invalidate(prefix,prefix_len,l * 2 + 2);
  if (iVar3 != 0) {
    lVar1 = *(long *)(*in_FS_OFFSET + -0x140);
    lVar2 = *(long *)(*in_FS_OFFSET + -0x130);
    *(long *)(*in_FS_OFFSET + -0x130) = lVar2 + 1;
    *(undefined1 *)(lVar1 + lVar2) = 0x22;
    ptls_hexdump((char *)(*(long *)(*in_FS_OFFSET + -0x140) + *(long *)(*in_FS_OFFSET + -0x130)),s,l
                );
    *(size_t *)(*in_FS_OFFSET + -0x130) = l * 2 + *(long *)(*in_FS_OFFSET + -0x130);
    lVar1 = *(long *)(*in_FS_OFFSET + -0x140);
    lVar2 = *(long *)(*in_FS_OFFSET + -0x130);
    *(long *)(*in_FS_OFFSET + -0x130) = lVar2 + 1;
    *(undefined1 *)(lVar1 + lVar2) = 0x22;
  }
  return;
}

Assistant:

void ptls_log__do_push_element_hexdump(const char *prefix, size_t prefix_len, const void *s, size_t l)
{
    if (expand_logbuf_or_invalidate(prefix, prefix_len, l * 2 + 2)) {
        logbuf.buf.base[logbuf.buf.off++] = '"';
        ptls_hexdump((char *)logbuf.buf.base + logbuf.buf.off, s, l);
        logbuf.buf.off += l * 2;
        logbuf.buf.base[logbuf.buf.off++] = '"';
    }
}